

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.h
# Opt level: O0

void __thiscall
Gudhi::ripser::
Persistent_cohomology<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>_>
::Persistent_cohomology
          (Persistent_cohomology<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>_>
           *this,Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>
                 *_filt,dimension_t _dim_max,coefficient_t _modulus)

{
  vertex_t vVar1;
  int *piVar2;
  uint m;
  int local_34;
  int local_30 [4];
  coefficient_t local_20;
  dimension_t local_19;
  coefficient_t _modulus_local;
  dimension_t _dim_max_local;
  Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>
  *_filt_local;
  Persistent_cohomology<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>_>
  *this_local;
  
  local_20 = _modulus;
  local_19 = _dim_max;
  __modulus_local = _filt;
  _filt_local = &this->filt;
  Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>
  ::Rips_filtration(&this->filt,_filt);
  vVar1 = Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>
          ::num_vertices(&this->filt);
  this->n = vVar1;
  local_30[0] = (int)local_19;
  local_34 = this->n + -2;
  piVar2 = std::min<int>(local_30,&local_34);
  this->dim_max = (dimension_t)*piVar2;
  this->modulus = local_20;
  multiplicative_inverse_vector<unsigned_short,unsigned_int>
            (&this->multiplicative_inverse_,(ripser *)(ulong)local_20,m);
  std::
  vector<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t,_std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t>_>
  ::vector(&this->cofacet_entries);
  std::vector<int,_std::allocator<int>_>::vector(&this->vertices);
  Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>
  ::Simplex_boundary_enumerator::Simplex_boundary_enumerator(&this->facets,&this->filt);
  Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>
  ::
  Simplex_coboundary_enumerator_<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Tag_sparse>
  ::Simplex_coboundary_enumerator_(&this->cofacets1,&this->filt);
  Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>
  ::
  Simplex_coboundary_enumerator_<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Tag_sparse>
  ::Simplex_coboundary_enumerator_(&this->cofacets2,&this->filt);
  return;
}

Assistant:

Persistent_cohomology(Filtration&& _filt, dimension_t _dim_max, coefficient_t _modulus)
    : filt(std::move(_filt)), n(filt.num_vertices()),
    dim_max(std::min<vertex_t>(_dim_max, n - 2)),
    modulus(_modulus),
    multiplicative_inverse_(multiplicative_inverse_vector<coefficient_storage_t>(_modulus)),
    facets(filt), cofacets1(filt), cofacets2(filt)
  {
    }